

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_pred.c
# Opt level: O0

void ipred_ipf_core(pel *src,pel *dst,int i_dst,int flt_range_hor,int flt_range_ver,s8 *flt_hor_coef
                   ,s8 *flt_ver_coef,int w,int h,int bit_depth)

{
  int iVar1;
  int iVar2;
  int local_90;
  pel local_8c;
  int local_88;
  int local_84;
  pel local_80;
  int local_7c;
  int local_78;
  pel local_74;
  int local_70;
  s32 sample_val_2;
  s32 coeff_cur_2;
  s32 coeff_left_1;
  s32 col_1;
  s32 sample_val_1;
  s32 coeff_cur_1;
  s32 sample_val;
  s32 coeff_cur;
  s32 coeff_left;
  int col;
  s32 coeff_top;
  int row;
  int max_val;
  pel *p_top;
  s8 *flt_hor_coef_local;
  int flt_range_ver_local;
  int flt_range_hor_local;
  int i_dst_local;
  pel *dst_local;
  pel *src_local;
  
  iVar1 = (1 << ((byte)bit_depth & 0x1f)) + -1;
  _flt_range_hor_local = dst;
  for (col = 0; col < flt_range_ver; col = col + 1) {
    iVar2 = (int)flt_ver_coef[col];
    for (coeff_cur = 0; coeff_cur < flt_range_hor; coeff_cur = coeff_cur + 1) {
      local_78 = (int)((int)flt_hor_coef[coeff_cur] * (uint)src[-1 - col] +
                       iVar2 * (uint)src[(long)coeff_cur + 1] +
                       ((0x40 - flt_hor_coef[coeff_cur]) - iVar2) *
                       (uint)_flt_range_hor_local[coeff_cur] + 0x20) >> 6;
      local_70 = local_78;
      if (iVar1 < local_78) {
        local_70 = iVar1;
      }
      if (local_70 < 0) {
        local_74 = '\0';
      }
      else {
        if (iVar1 < local_78) {
          local_78 = iVar1;
        }
        local_74 = (pel)local_78;
      }
      _flt_range_hor_local[coeff_cur] = local_74;
    }
    for (; coeff_cur < w; coeff_cur = coeff_cur + 1) {
      local_84 = (int)(iVar2 * (uint)src[(long)coeff_cur + 1] +
                       (0x40 - iVar2) * (uint)_flt_range_hor_local[coeff_cur] + 0x20) >> 6;
      local_7c = local_84;
      if (iVar1 < local_84) {
        local_7c = iVar1;
      }
      if (local_7c < 0) {
        local_80 = '\0';
      }
      else {
        if (iVar1 < local_84) {
          local_84 = iVar1;
        }
        local_80 = (pel)local_84;
      }
      _flt_range_hor_local[coeff_cur] = local_80;
    }
    _flt_range_hor_local = _flt_range_hor_local + i_dst;
  }
  for (; col < h; col = col + 1) {
    for (coeff_cur_2 = 0; coeff_cur_2 < flt_range_hor; coeff_cur_2 = coeff_cur_2 + 1) {
      local_90 = (int)((int)flt_hor_coef[coeff_cur_2] * (uint)src[-1 - col] +
                       (0x40 - flt_hor_coef[coeff_cur_2]) * (uint)_flt_range_hor_local[coeff_cur_2]
                      + 0x20) >> 6;
      local_88 = local_90;
      if (iVar1 < local_90) {
        local_88 = iVar1;
      }
      if (local_88 < 0) {
        local_8c = '\0';
      }
      else {
        if (iVar1 < local_90) {
          local_90 = iVar1;
        }
        local_8c = (pel)local_90;
      }
      _flt_range_hor_local[coeff_cur_2] = local_8c;
    }
    _flt_range_hor_local = _flt_range_hor_local + i_dst;
  }
  return;
}

Assistant:

void ipred_ipf_core(pel *src, pel *dst, int i_dst, int flt_range_hor, int flt_range_ver, const s8* flt_hor_coef, const s8* flt_ver_coef, int w, int h, int bit_depth)
{
    pel *p_top = src + 1;
    int max_val = (1 << bit_depth) - 1;
    int row;

    for (row = 0; row < flt_range_ver; ++row) {
        s32 coeff_top = flt_ver_coef[row];
        int col;
        for (col = 0; col < flt_range_hor; col++) {
            s32 coeff_left = flt_hor_coef[col];
            s32 coeff_cur = 64 - coeff_left - coeff_top;
            s32 sample_val = (coeff_left* src[-row - 1] + coeff_top * p_top[col] + coeff_cur * dst[col] + 32) >> 6;
            dst[col] = COM_CLIP3(0, max_val, sample_val);
        }
        for (; col < w; col++) {
            s32 coeff_cur = 64 - coeff_top;
            s32 sample_val = (coeff_top * p_top[col] + coeff_cur * dst[col] + 32) >> 6;
            dst[col] = COM_CLIP3(0, max_val, sample_val);
        }
        dst += i_dst;
    }
    for (; row < h; ++row) {
        for (s32 col = 0; col < flt_range_hor; col++) {
            s32 coeff_left = flt_hor_coef[col];
            s32 coeff_cur = 64 - coeff_left;
            s32 sample_val = (coeff_left* src[-row - 1] + coeff_cur * dst[col] + 32) >> 6;
            dst[col] = COM_CLIP3(0, max_val, sample_val);
        }
        dst += i_dst;
    }
}